

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

bool __thiscall cmComputeLinkInformation::Compute(cmComputeLinkInformation *this)

{
  LinkEntry *entry;
  pointer pLVar1;
  pointer pIVar2;
  _Base_ptr p_Var3;
  pointer pcVar4;
  cmGeneratorTarget *pcVar5;
  cmake *this_00;
  undefined1 config [8];
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *pvVar9;
  FeatureDescriptor *pFVar10;
  const_iterator cVar11;
  _Base_ptr p_Var12;
  string *psVar13;
  cmValue cVar14;
  _Rb_tree_node_base *p_Var15;
  ostream *poVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  PolicyID id;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar17;
  LinkType lt;
  _Base_ptr p_Var18;
  pointer pLVar19;
  string_view value;
  string_view separator;
  ostringstream w;
  cmComputeLinkDepends cld;
  string local_5b0;
  char *local_590;
  size_type local_588;
  char local_580;
  undefined7 uStack_57f;
  undefined8 uStack_578;
  char *local_570;
  size_type local_568;
  char local_560;
  undefined7 uStack_55f;
  undefined8 uStack_558;
  char *local_550;
  size_type local_548;
  char local_540;
  undefined7 uStack_53f;
  undefined8 uStack_538;
  char *local_530;
  size_type local_528;
  char local_520;
  undefined7 uStack_51f;
  undefined8 uStack_518;
  char *local_510;
  size_type local_508;
  char local_500;
  undefined7 uStack_4ff;
  undefined8 uStack_4f8;
  undefined1 local_4f0 [32];
  _Alloc_hider local_4d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
  *local_4c8;
  undefined1 local_4c0 [8];
  undefined1 local_4b8 [17];
  undefined7 uStack_4a7;
  undefined8 uStack_4a0;
  element_type *local_498;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_490;
  ios_base local_448 [264];
  undefined1 local_340 [16];
  undefined8 local_330;
  _Rb_tree_node_base *local_70;
  
  TVar7 = cmGeneratorTarget::GetType(this->Target);
  if ((((TVar7 != EXECUTABLE) &&
       (TVar7 = cmGeneratorTarget::GetType(this->Target), TVar7 != SHARED_LIBRARY)) &&
      (TVar7 = cmGeneratorTarget::GetType(this->Target), TVar7 != MODULE_LIBRARY)) &&
     (TVar7 = cmGeneratorTarget::GetType(this->Target), TVar7 != STATIC_LIBRARY)) {
    return false;
  }
  if ((this->LinkLanguage)._M_string_length == 0) {
    psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                   "CMake can not determine linker language for target: ",psVar13);
    cmSystemTools::Error
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    if ((cmGeneratorTarget *)local_340._0_8_ == (cmGeneratorTarget *)&stack0xfffffffffffffcd0) {
      return false;
    }
    operator_delete((void *)local_340._0_8_,(ulong)(local_330 + 1));
    return false;
  }
  cmComputeLinkDepends::cmComputeLinkDepends
            ((cmComputeLinkDepends *)local_340,this->Target,&this->Config,&this->LinkLanguage);
  cmComputeLinkDepends::SetOldLinkDirMode((cmComputeLinkDepends *)local_340,this->OldLinkDirMode);
  local_4c0 = (undefined1  [8])&this->Config;
  pvVar9 = cmComputeLinkDepends::Compute((cmComputeLinkDepends *)local_340);
  pLVar19 = (pvVar9->
            super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (pvVar9->
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar19 != pLVar1) {
    local_4c8 = &this->LibraryFeatureDescriptors;
    local_4d0._M_p = (pointer)&(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header;
    p_Var18 = (_Base_ptr)0x0;
    psVar13 = &pLVar19->Feature;
    do {
      entry = (LinkEntry *)(psVar13 + -2);
      if (*(int *)((long)&psVar13[-1].field_2 + 8) == 4) {
        pFVar10 = GetGroupFeature(this,psVar13);
        if (pFVar10->Supported == true) {
          iVar8 = std::__cxx11::string::compare((char *)entry);
          if ((iVar8 == 0) && (p_Var18 != (_Base_ptr)0x0)) {
            if (p_Var18[2]._M_left != (_Base_ptr)0x0) {
              local_530 = &local_520;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_530,p_Var18[2]._M_parent,
                         (long)&(p_Var18[2]._M_parent)->_M_color +
                         (long)&(p_Var18[2]._M_left)->_M_color);
              pIVar2 = (this->Items).
                       super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              local_498 = pIVar2[-1].Value.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
              local_490._M_pi =
                   pIVar2[-1].Value.Backtrace.
                   super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
              if (local_490._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_490._M_pi)->_M_use_count = (local_490._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_490._M_pi)->_M_use_count = (local_490._M_pi)->_M_use_count + 1;
                }
              }
              if (local_530 == &local_520) {
                uStack_4a0 = uStack_518;
                local_4b8._0_8_ = local_4b8 + 0x10;
              }
              else {
                local_4b8._0_8_ = local_530;
              }
              uStack_4a7 = uStack_51f;
              local_4b8[0x10] = local_520;
              local_4b8._8_8_ = local_528;
              local_528 = 0;
              local_520 = '\0';
              local_5b0._M_dataplus._M_p._0_4_ = 0;
              local_530 = &local_520;
              std::
              vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
              ::emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                        ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                          *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_4b8,(ItemIsPath *)&local_5b0);
              if (local_490._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490._M_pi);
              }
              if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
                operator_delete((void *)local_4b8._0_8_,stack0xfffffffffffffb58 + 1);
              }
              if (local_530 != &local_520) {
                operator_delete(local_530,CONCAT71(uStack_51f,local_520) + 1);
              }
            }
            p_Var18 = (_Base_ptr)0x0;
          }
          iVar8 = std::__cxx11::string::compare((char *)entry);
          local_550 = &local_540;
          pcVar4 = (&pFVar10->Prefix)[iVar8 != 0]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_550,pcVar4,
                     pcVar4 + (&pFVar10->Prefix)[iVar8 != 0]._M_string_length);
          local_498 = (element_type *)psVar13[-1]._M_dataplus._M_p;
          local_490._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar13[-1]._M_string_length;
          if (local_490._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_490._M_pi)->_M_use_count = (local_490._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_490._M_pi)->_M_use_count = (local_490._M_pi)->_M_use_count + 1;
            }
          }
          local_4b8._0_8_ = local_4b8 + 0x10;
          if (local_550 == &local_540) {
            uStack_4a0 = uStack_538;
          }
          else {
            local_4b8._0_8_ = local_550;
          }
          uStack_4a7 = uStack_53f;
          local_4b8[0x10] = local_540;
          local_4b8._8_8_ = local_548;
          local_548 = 0;
          local_540 = '\0';
          local_5b0._M_dataplus._M_p._0_4_ = 0;
          local_550 = &local_540;
          std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
          ::emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                    ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                      *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_4b8,(ItemIsPath *)&local_5b0);
          if (local_490._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490._M_pi);
          }
          if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
            operator_delete((void *)local_4b8._0_8_,stack0xfffffffffffffb58 + 1);
          }
          if (local_550 != &local_540) {
            operator_delete(local_550,CONCAT71(uStack_53f,local_540) + 1);
          }
        }
      }
      else {
        if (p_Var18 == (_Base_ptr)0x0) {
LAB_0042ca73:
          p_Var18 = (_Base_ptr)0x0;
        }
        else {
          p_Var3 = (_Base_ptr)psVar13->_M_string_length;
          if ((p_Var3 != p_Var18->_M_parent) ||
             ((p_Var3 != (_Base_ptr)0x0 &&
              (iVar8 = bcmp((psVar13->_M_dataplus)._M_p,*(void **)p_Var18,(size_t)p_Var3),
              iVar8 != 0)))) {
            if (p_Var18[2]._M_left != (_Base_ptr)0x0) {
              local_570 = &local_560;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_570,p_Var18[2]._M_parent,
                         (long)&(p_Var18[2]._M_parent)->_M_color +
                         (long)&(p_Var18[2]._M_left)->_M_color);
              pIVar2 = (this->Items).
                       super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              local_498 = pIVar2[-1].Value.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
              local_490._M_pi =
                   pIVar2[-1].Value.Backtrace.
                   super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
              if (local_490._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_490._M_pi)->_M_use_count = (local_490._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_490._M_pi)->_M_use_count = (local_490._M_pi)->_M_use_count + 1;
                }
              }
              if (local_570 == &local_560) {
                uStack_4a0 = uStack_558;
                local_4b8._0_8_ = local_4b8 + 0x10;
              }
              else {
                local_4b8._0_8_ = local_570;
              }
              uStack_4a7 = uStack_55f;
              local_4b8[0x10] = local_560;
              local_4b8._8_8_ = local_568;
              local_568 = 0;
              local_560 = '\0';
              local_5b0._M_dataplus._M_p._0_4_ = 0;
              local_570 = &local_560;
              std::
              vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
              ::emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                        ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                          *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_4b8,(ItemIsPath *)&local_5b0);
              if (local_490._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490._M_pi);
              }
              if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
                operator_delete((void *)local_4b8._0_8_,stack0xfffffffffffffb58 + 1);
              }
              if (local_570 != &local_560) {
                operator_delete(local_570,CONCAT71(uStack_55f,local_560) + 1);
              }
            }
            goto LAB_0042ca73;
          }
        }
        p_Var3 = (_Base_ptr)psVar13->_M_string_length;
        if (((p_Var3 != (_Base_ptr)
                        cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) ||
            ((p_Var3 != (_Base_ptr)0x0 &&
             (iVar8 = bcmp((psVar13->_M_dataplus)._M_p,
                           cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,
                           (size_t)p_Var3), iVar8 != 0)))) &&
           ((p_Var18 == (_Base_ptr)0x0 ||
            ((p_Var3 != p_Var18->_M_parent ||
             ((p_Var3 != (_Base_ptr)0x0 &&
              (iVar8 = bcmp((psVar13->_M_dataplus)._M_p,*(void **)p_Var18,(size_t)p_Var3),
              iVar8 != 0)))))))) {
          bVar6 = AddLibraryFeature(this,psVar13);
          if (!bVar6) goto LAB_0042ce86;
          cVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
                   ::find(&local_4c8->_M_t,psVar13);
          p_Var18 = cVar11._M_node + 2;
          p_Var12 = (_Base_ptr)0x0;
          if (cVar11._M_node != (_Base_ptr)local_4d0._M_p) {
            p_Var12 = p_Var18;
          }
          if (p_Var12[1]._M_left != (_Base_ptr)0x0) {
            local_590 = &local_580;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_590,p_Var12[1]._M_parent,
                       (long)&(p_Var12[1]._M_parent)->_M_color +
                       (long)&(p_Var12[1]._M_left)->_M_color);
            local_498 = (element_type *)psVar13[-1]._M_dataplus._M_p;
            local_490._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar13[-1]._M_string_length;
            if (local_490._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_490._M_pi)->_M_use_count = (local_490._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_490._M_pi)->_M_use_count = (local_490._M_pi)->_M_use_count + 1;
              }
            }
            local_4b8._0_8_ = local_4b8 + 0x10;
            if (local_590 == &local_580) {
              uStack_4a0 = uStack_578;
            }
            else {
              local_4b8._0_8_ = local_590;
            }
            uStack_4a7 = uStack_57f;
            local_4b8[0x10] = local_580;
            local_4b8._8_8_ = local_588;
            local_588 = 0;
            local_580 = '\0';
            local_5b0._M_dataplus._M_p._0_4_ = 0;
            local_590 = &local_580;
            std::
            vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
            emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                      ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                        *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_4b8,(ItemIsPath *)&local_5b0);
            if (local_490._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490._M_pi);
            }
            if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
              operator_delete((void *)local_4b8._0_8_,stack0xfffffffffffffb58 + 1);
            }
            if (local_590 != &local_580) {
              operator_delete(local_590,CONCAT71(uStack_57f,local_580) + 1);
            }
          }
        }
        if (*(int *)((long)&psVar13[-1].field_2 + 8) == 2) {
          AddSharedDepItem(this,entry);
        }
        else {
          AddItem(this,entry);
        }
      }
LAB_0042ce86:
      pLVar19 = (pointer)(psVar13 + 1);
      psVar13 = psVar13 + 3;
    } while (pLVar19 != pLVar1);
    if ((p_Var18 != (_Base_ptr)0x0) && (p_Var18[2]._M_left != (_Base_ptr)0x0)) {
      local_510 = &local_500;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_510,p_Var18[2]._M_parent,
                 (long)&(p_Var18[2]._M_parent)->_M_color + (long)&(p_Var18[2]._M_left)->_M_color);
      pIVar2 = (this->Items).
               super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_498 = pIVar2[-1].Value.Backtrace.
                  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      local_490._M_pi =
           pIVar2[-1].Value.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_490._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_490._M_pi)->_M_use_count = (local_490._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_490._M_pi)->_M_use_count = (local_490._M_pi)->_M_use_count + 1;
        }
      }
      if (local_510 == &local_500) {
        uStack_4a0 = uStack_4f8;
        local_4b8._0_8_ = local_4b8 + 0x10;
      }
      else {
        local_4b8._0_8_ = local_510;
      }
      uStack_4a7 = uStack_4ff;
      local_4b8[0x10] = local_500;
      local_4b8._8_8_ = local_508;
      local_508 = 0;
      local_500 = '\0';
      local_5b0._M_dataplus._M_p._0_4_ = 0;
      local_510 = &local_500;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_4b8,(ItemIsPath *)&local_5b0);
      if (local_490._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490._M_pi);
      }
      if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
        operator_delete((void *)local_4b8._0_8_,stack0xfffffffffffffb58 + 1);
      }
      if (local_510 != &local_500) {
        operator_delete(local_510,CONCAT71(uStack_4ff,local_500) + 1);
      }
    }
  }
  pcVar5 = this->Target;
  local_4b8._0_8_ = local_4b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"LINK_SEARCH_END_STATIC","");
  cVar14 = cmGeneratorTarget::GetProperty(pcVar5,(string *)local_4b8);
  pcVar17 = extraout_RDX;
  if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
    operator_delete((void *)local_4b8._0_8_,stack0xfffffffffffffb58 + 1);
    pcVar17 = extraout_RDX_00;
  }
  if (cVar14.Value != (string *)0x0) {
    value._M_str = pcVar17;
    value._M_len = (size_t)((cVar14.Value)->_M_dataplus)._M_p;
    bVar6 = cmValue::IsOn((cmValue *)(cVar14.Value)->_M_string_length,value);
    lt = LinkStatic;
    if (bVar6) goto LAB_0042d0a8;
  }
  lt = this->StartLinkType;
LAB_0042d0a8:
  SetCurrentLinkType(this,lt);
  if ((this->OldLinkDirMode == true) && (local_70 != (_Rb_tree_node_base *)&stack0xffffffffffffff80)
     ) {
    p_Var15 = local_70;
    do {
      config = local_4c0;
      pcVar5 = *(cmGeneratorTarget **)(p_Var15 + 1);
      bVar6 = cmGeneratorTarget::HasImportLibrary(pcVar5,(string *)local_4c0);
      cmGeneratorTarget::GetFullPath((string *)local_4b8,pcVar5,(string *)config,(uint)bVar6,true);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->OldLinkDirItems,(string *)local_4b8);
      if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
        operator_delete((void *)local_4b8._0_8_,stack0xfffffffffffffb58 + 1);
      }
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != (_Rb_tree_node_base *)&stack0xffffffffffffff80);
  }
  bVar6 = FinishLinkerSearchDirectories(this);
  if ((bVar6) &&
     (AddImplicitLinkInfo(this),
     (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_5b0,(cmPolicies *)0x3c,id);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,
                         (char *)CONCAT44(local_5b0._M_dataplus._M_p._4_4_,
                                          local_5b0._M_dataplus._M_p._0_4_),
                         local_5b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,
               "\nSome library files are in directories implicitly searched by the linker when invoked for "
               ,0x5a);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,(this->LinkLanguage)._M_dataplus._M_p,
                         (this->LinkLanguage)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,":\n ",3);
    separator._M_str = "\n ";
    separator._M_len = 2;
    cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((string *)local_4f0,&this->CMP0060WarnItems,separator);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,(char *)local_4f0._0_8_,local_4f0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,
               "\nFor compatibility with older versions of CMake, the generated link line will ask the linker to search for these by library name."
               ,0x81);
    if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
      operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_5b0._M_dataplus._M_p._4_4_,local_5b0._M_dataplus._M_p._0_4_) !=
        &local_5b0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_5b0._M_dataplus._M_p._4_4_,local_5b0._M_dataplus._M_p._0_4_),
                      local_5b0.field_2._M_allocated_capacity + 1);
    }
    this_00 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_4f0);
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_5b0,(cmListFileBacktrace *)local_4f0);
    if ((cmMakefile *)local_4f0._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_5b0._M_dataplus._M_p._4_4_,local_5b0._M_dataplus._M_p._0_4_) !=
        &local_5b0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_5b0._M_dataplus._M_p._4_4_,local_5b0._M_dataplus._M_p._0_4_),
                      local_5b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
    std::ios_base::~ios_base(local_448);
  }
  cmComputeLinkDepends::~cmComputeLinkDepends((cmComputeLinkDepends *)local_340);
  return bVar6;
}

Assistant:

bool cmComputeLinkInformation::Compute()
{
  // Skip targets that do not link.
  if (!(this->Target->GetType() == cmStateEnums::EXECUTABLE ||
        this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::STATIC_LIBRARY)) {
    return false;
  }

  // We require a link language for the target.
  if (this->LinkLanguage.empty()) {
    cmSystemTools::Error(
      "CMake can not determine linker language for target: " +
      this->Target->GetName());
    return false;
  }

  // Compute the ordered link line items.
  cmComputeLinkDepends cld(this->Target, this->Config, this->LinkLanguage);
  cld.SetOldLinkDirMode(this->OldLinkDirMode);
  cmComputeLinkDepends::EntryVector const& linkEntries = cld.Compute();
  FeatureDescriptor const* currentFeature = nullptr;

  // Add the link line items.
  for (cmComputeLinkDepends::LinkEntry const& linkEntry : linkEntries) {
    if (linkEntry.Kind == cmComputeLinkDepends::LinkEntry::Group) {
      const auto& groupFeature = this->GetGroupFeature(linkEntry.Feature);
      if (groupFeature.Supported) {
        if (linkEntry.Item.Value == "</LINK_GROUP>" &&
            currentFeature != nullptr) {
          // emit feature suffix, if any
          if (!currentFeature->Suffix.empty()) {
            this->Items.emplace_back(
              BT<std::string>{ currentFeature->Suffix,
                               this->Items.back().Value.Backtrace },
              ItemIsPath::No);
          }
          currentFeature = nullptr;
        }
        this->Items.emplace_back(
          BT<std::string>{ linkEntry.Item.Value == "<LINK_GROUP>"
                             ? groupFeature.Prefix
                             : groupFeature.Suffix,
                           linkEntry.Item.Backtrace },
          ItemIsPath::No);
      }
      continue;
    }

    if (currentFeature != nullptr &&
        linkEntry.Feature != currentFeature->Name) {
      // emit feature suffix, if any
      if (!currentFeature->Suffix.empty()) {
        this->Items.emplace_back(
          BT<std::string>{ currentFeature->Suffix,
                           this->Items.back().Value.Backtrace },
          ItemIsPath::No);
      }
      currentFeature = nullptr;
    }

    if (linkEntry.Feature != DEFAULT &&
        (currentFeature == nullptr ||
         linkEntry.Feature != currentFeature->Name)) {
      if (!this->AddLibraryFeature(linkEntry.Feature)) {
        continue;
      }
      currentFeature = this->FindLibraryFeature(linkEntry.Feature);
      // emit feature prefix, if any
      if (!currentFeature->Prefix.empty()) {
        this->Items.emplace_back(
          BT<std::string>{ currentFeature->Prefix, linkEntry.Item.Backtrace },
          ItemIsPath::No);
      }
    }

    if (linkEntry.Kind == cmComputeLinkDepends::LinkEntry::SharedDep) {
      this->AddSharedDepItem(linkEntry);
    } else {
      this->AddItem(linkEntry);
    }
  }

  if (currentFeature != nullptr) {
    // emit feature suffix, if any
    if (!currentFeature->Suffix.empty()) {
      this->Items.emplace_back(
        BT<std::string>{ currentFeature->Suffix,
                         this->Items.back().Value.Backtrace },
        ItemIsPath::No);
    }
  }

  // Restore the target link type so the correct system runtime
  // libraries are found.
  cmValue lss = this->Target->GetProperty("LINK_SEARCH_END_STATIC");
  if (cmIsOn(lss)) {
    this->SetCurrentLinkType(LinkStatic);
  } else {
    this->SetCurrentLinkType(this->StartLinkType);
  }

  // Finish listing compatibility paths.
  if (this->OldLinkDirMode) {
    // For CMake 2.4 bug-compatibility we need to consider the output
    // directories of targets linked in another configuration as link
    // directories.
    std::set<cmGeneratorTarget const*> const& wrongItems =
      cld.GetOldWrongConfigItems();
    for (cmGeneratorTarget const* tgt : wrongItems) {
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(this->Config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      this->OldLinkDirItems.push_back(
        tgt->GetFullPath(this->Config, artifact, true));
    }
  }

  // Finish setting up linker search directories.
  if (!this->FinishLinkerSearchDirectories()) {
    return false;
  }

  // Add implicit language runtime libraries and directories.
  this->AddImplicitLinkInfo();

  if (!this->CMP0060WarnItems.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0060) << "\n"
      "Some library files are in directories implicitly searched by "
      "the linker when invoked for " << this->LinkLanguage << ":\n"
      " " << cmJoin(this->CMP0060WarnItems, "\n ") << "\n"
      "For compatibility with older versions of CMake, the generated "
      "link line will ask the linker to search for these by library "
      "name."
      ;
    /* clang-format on */
    this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                      this->Target->GetBacktrace());
  }

  return true;
}